

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O3

void matrixVectorTest1(void)

{
  size_t c;
  ostream *poVar1;
  long lVar2;
  float *pfVar3;
  size_t r;
  ulong uVar4;
  long lVar5;
  Vector<float,_4UL> *inv;
  float fVar6;
  Matrix<float,_4UL,_4UL> in;
  AffineMatrix4T<float> local_118;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Matrix<float,_4UL,_4UL> local_a8;
  Vector<float,_4UL> local_68 [3];
  float local_38 [2];
  float afStack_30 [2];
  
  Gs::Matrix<float,_4UL,_4UL>::Identity();
  Gs::AffineMatrix4T<float>::Identity();
  local_b8 = local_c8 * -1.6666666 + local_e8 * 4.0 + local_d8 + local_d8 + local_b8;
  fStack_b4 = fStack_c4 * -1.6666666 + fStack_e4 * 4.0 + fStack_d4 + fStack_d4 + fStack_b4;
  fStack_b0 = fStack_c0 * -1.6666666 + fStack_e0 * 4.0 + fStack_d0 + fStack_d0 + fStack_b0;
  fStack_ac = fStack_bc * -1.6666666 + fStack_dc * 4.0 + fStack_cc + fStack_cc + fStack_ac;
  local_118.m_[3] = local_118.m_[3] * 2.0;
  local_118.m_[4] = local_118.m_[4] * 2.0;
  local_118.m_[5] = local_118.m_[5] * 2.0;
  local_118.m_[6] = local_118.m_[6] * 3.0;
  local_118.m_[7] = local_118.m_[7] * 3.0;
  local_118.m_[8] = local_118.m_[8] * 3.0;
  local_118.m_[9] =
       local_118.m_[9] +
       local_118.m_[6] * -1.6666666 + local_118.m_[0] * 4.0 + local_118.m_[3] + local_118.m_[3];
  local_118.m_[10] =
       local_118.m_[10] +
       local_118.m_[7] * -1.6666666 + local_118.m_[1] * 4.0 + local_118.m_[4] + local_118.m_[4];
  local_118.m_[0xb] =
       local_118.m_[8] * -1.6666666 + local_118.m_[2] * 4.0 + local_118.m_[5] + local_118.m_[5] +
       local_118.m_[0xb];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)&local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>(poVar1,&local_118)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A^-1 = ",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_a8.m_[0xd] = fStack_b4;
  local_a8.m_[0xc] = local_b8;
  local_a8.m_[0xf] = fStack_ac;
  local_a8.m_[0xe] = fStack_b0;
  inv = local_68;
  local_38 = (float  [2])local_a8.m_._48_8_;
  afStack_30 = (float  [2])local_a8.m_._56_8_;
  Gs::Inverse<float>((Matrix<float,_4UL,_4UL> *)inv,&local_a8);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)inv);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A*A^-1 = ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_a8.m_[0xd] = fStack_b4;
  local_a8.m_[0xc] = local_b8;
  local_a8.m_[0xf] = fStack_ac;
  local_a8.m_[0xe] = fStack_b0;
  local_38 = (float  [2])local_a8.m_._48_8_;
  afStack_30 = (float  [2])local_a8.m_._56_8_;
  Gs::Inverse<float>((Matrix<float,_4UL,_4UL> *)inv,&local_a8);
  lVar2 = 0;
  do {
    uVar4 = 0;
    pfVar3 = &local_e8;
    do {
      fVar6 = 0.0;
      lVar5 = 0;
      do {
        fVar6 = fVar6 + pfVar3[lVar5] * *(float *)((long)&inv->x + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      local_a8.m_[uVar4 | lVar2 * 4] = fVar6;
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 1;
    } while (uVar4 != 4);
    lVar2 = lVar2 + 1;
    inv = inv + 1;
  } while (lVar2 != 4);
  poVar1 = Gs::operator<<(poVar1,&local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_a8.m_[1] = fStack_c4 * 0.0 + fStack_e4 * 0.0 + fStack_d4 * 0.0 + fStack_b4;
  local_a8.m_[0] = local_c8 * 0.0 + local_e8 * 0.0 + local_d8 * 0.0 + local_b8;
  local_a8.m_[3] = fStack_bc * 0.0 + fStack_dc * 0.0 + fStack_cc * 0.0 + fStack_ac;
  local_a8.m_[2] = fStack_c0 * 0.0 + fStack_e0 * 0.0 + fStack_d0 * 0.0 + fStack_b0;
  local_68[0].y =
       local_118.m_[7] * 0.0 + local_118.m_[1] * 0.0 + local_118.m_[4] * 0.0 + local_118.m_[10];
  local_68[0].x =
       local_118.m_[6] * 0.0 + local_118.m_[0] * 0.0 + local_118.m_[3] * 0.0 + local_118.m_[9];
  local_68[0].w = 1.0;
  local_68[0].z =
       local_118.m_[8] * 0.0 + local_118.m_[2] * 0.0 + local_118.m_[5] * 0.0 + local_118.m_[0xb];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a = ",4);
  poVar1 = Gs::operator<<((ostream *)&std::cout,(Vector<float,_4UL> *)&local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"b = ",4);
  poVar1 = Gs::operator<<((ostream *)&std::cout,local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void matrixVectorTest1()
{
    Matrix4 A = Matrix4::Identity();
    AffineMatrix4 B = AffineMatrix4::Identity();

    Translate(A, Vector3(4, 2, -5.0f/3.0f));
    Scale(B, Vector3(1, 2, 3));
    Translate(B, Vector3(4, 2, -5.0f/3.0f));

    #if 1
    std::cout << "A = " << std::endl << A << std::endl;
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "A^-1 = " << std::endl << A.Inverse() << std::endl;
    std::cout << "A*A^-1 = " << std::endl << A*A.Inverse() << std::endl;
    #endif

    auto a = TransformVector(A, Vector4(0, 0, 0, 1));
    auto b = TransformVector(B, Vector4(0, 0, 0, 1));

    //Translate(A, a.xyz()*2.0f);
    //Translate(B, a.yxz());

    std::cout << "a = " << a << std::endl;
    std::cout << "b = " << b << std::endl;
}